

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O2

int __thiscall ipx::Multistream::multibuffer::overflow(multibuffer *this,int c)

{
  pointer ppbVar1;
  pointer ppbVar2;
  
  ppbVar1 = (this->buffers).
            super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar2 = (this->buffers).
                 super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar2 != ppbVar1;
      ppbVar2 = ppbVar2 + 1) {
    std::streambuf::sputc((char)*ppbVar2);
  }
  return c;
}

Assistant:

int overflow(int c) override {
            for (std::streambuf* b : buffers)
                b->sputc(static_cast<char>(c));
            return c;
        }